

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O1

bool __thiscall
Fossilize::ZipDatabase::write_entry
          (ZipDatabase *this,ResourceTag tag,Hash hash,void *blob,size_t size,
          PayloadWriteFlags flags)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  bool bVar3;
  mz_bool mVar4;
  LogLevel LVar5;
  ulong uVar6;
  ulong uVar7;
  __node_base_ptr p_Var8;
  __node_base_ptr p_Var9;
  bool bVar10;
  char str [41];
  Hash local_88;
  long local_80;
  undefined4 local_78;
  size_t local_70;
  char local_68 [24];
  char local_50 [32];
  
  if ((flags & 1) == 0) {
    bVar10 = false;
    if ((this->alive == true) && (bVar10 = false, this->mode != ReadOnly)) {
      uVar6 = (ulong)tag;
      local_80 = uVar6 * 0x38;
      uVar1 = this->seen_blobs[uVar6]._M_h._M_bucket_count;
      uVar7 = hash % uVar1;
      p_Var8 = this->seen_blobs[uVar6]._M_h._M_buckets[uVar7];
      p_Var9 = (__node_base_ptr)0x0;
      if ((p_Var8 != (__node_base_ptr)0x0) &&
         (p_Var2 = p_Var8->_M_nxt, p_Var9 = p_Var8,
         p_Var8->_M_nxt[1]._M_nxt != (_Hash_node_base *)hash)) {
        while (p_Var8 = p_Var2, p_Var2 = p_Var8->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
          p_Var9 = (__node_base_ptr)0x0;
          if (((ulong)p_Var2[1]._M_nxt % uVar1 != uVar7) ||
             (p_Var9 = p_Var8, p_Var2[1]._M_nxt == (_Hash_node_base *)hash)) goto LAB_001426a1;
        }
        p_Var9 = (__node_base_ptr)0x0;
      }
LAB_001426a1:
      if ((p_Var9 == (__node_base_ptr)0x0) ||
         (bVar10 = true, p_Var9->_M_nxt == (_Hash_node_base *)0x0)) {
        local_88 = hash;
        sprintf(local_68,"%0*x",0x18,tag);
        sprintf(local_50,"%016lx",local_88);
        mVar4 = mz_zip_writer_add_mem
                          (&this->mz,local_68,blob,size,
                           (flags & 4) * 2 + 1 & (int)(flags << 0x1e) >> 0x1f);
        bVar10 = mVar4 != 0;
        if (mVar4 == 0) {
          LVar5 = get_thread_log_level();
          if (((int)LVar5 < 3) &&
             (bVar3 = Internal::log_thread_callback(LOG_ERROR,"Failed to add blob to cache.\n"),
             !bVar3)) {
            write_entry();
          }
        }
        else {
          bVar3 = DatabaseInterface::test_resource_filter
                            (&this->super_DatabaseInterface,tag,local_88);
          if (bVar3) {
            local_78 = 0xffffffff;
            local_70 = size;
            std::
            _Hashtable<unsigned_long,std::pair<unsigned_long_const,Fossilize::ZipDatabase::Entry>,std::allocator<std::pair<unsigned_long_const,Fossilize::ZipDatabase::Entry>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::_M_emplace<unsigned_long&,Fossilize::ZipDatabase::Entry>
                      ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,Fossilize::ZipDatabase::Entry>,std::allocator<std::pair<unsigned_long_const,Fossilize::ZipDatabase::Entry>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)((long)&this->seen_blobs[0]._M_h._M_buckets + local_80),&local_88);
          }
        }
      }
    }
  }
  else {
    bVar10 = false;
  }
  return bVar10;
}

Assistant:

bool write_entry(ResourceTag tag, Hash hash, const void *blob, size_t size, PayloadWriteFlags flags) override
	{
		if ((flags & PAYLOAD_WRITE_RAW_FOSSILIZE_DB_BIT) != 0)
			return false;

		if (!alive || mode == DatabaseMode::ReadOnly)
			return false;

		auto itr = seen_blobs[tag].find(hash);
		if (itr != end(seen_blobs[tag]))
			return true;

		char str[FOSSILIZE_BLOB_HASH_LENGTH + 1]; // 40 digits + null
		sprintf(str, "%0*x", FOSSILIZE_BLOB_HASH_LENGTH - 16, tag);
		sprintf(str + FOSSILIZE_BLOB_HASH_LENGTH - 16, "%016" PRIx64, hash);

		unsigned mz_flags;
		if ((flags & PAYLOAD_WRITE_COMPRESS_BIT) != 0)
		{
			if ((flags & PAYLOAD_WRITE_BEST_COMPRESSION_BIT) != 0)
				mz_flags = MZ_BEST_COMPRESSION;
			else
				mz_flags = MZ_BEST_SPEED;
		}
		else
			mz_flags = MZ_NO_COMPRESSION;

		if (!mz_zip_writer_add_mem(&mz, str, blob, size, mz_flags))
		{
			LOGE_LEVEL("Failed to add blob to cache.\n");
			return false;
		}

		// The index is irrelevant, we're not going to read from this archive any time soon.
		if (test_resource_filter(static_cast<ResourceTag>(tag), hash))
			seen_blobs[tag].emplace(hash, Entry{~0u, size});
		return true;
	}